

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledFont8x8.cxx
# Opt level: O0

OledPoint SSD1306::drawString8x8(OledPoint *p,char *string,PixelStyle style,OledPixel *oled)

{
  int iVar1;
  int iVar2;
  char *in_RSI;
  OledPoint *in_RDI;
  PixelStyle unaff_retaddr;
  uint8_t unaff_retaddr_00;
  OledPoint *in_stack_00000008;
  OledPoint start;
  OledPoint position;
  OledPoint local_30 [3];
  char *local_18;
  OledPoint oled_00;
  
  oled_00 = *in_RDI;
  if (in_RSI != (char *)0x0) {
    local_30[0] = *in_RDI;
    for (local_18 = in_RSI; *local_18 != '\0'; local_18 = local_18 + 1) {
      if (*local_18 == '\n') {
        iVar1 = Point<int>::x(local_30);
        iVar2 = Point<int>::y((Point<int> *)&stack0xfffffffffffffff8);
        Point<int>::set((Point<int> *)&stack0xfffffffffffffff8,iVar1,iVar2 + 8);
      }
      else {
        drawChar8x8(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,(OledPixel *)oled_00);
        iVar1 = Point<int>::x((Point<int> *)&stack0xfffffffffffffff8);
        iVar2 = Point<int>::y((Point<int> *)&stack0xfffffffffffffff8);
        Point<int>::set((Point<int> *)&stack0xfffffffffffffff8,iVar1 + 8,iVar2);
      }
    }
  }
  return oled_00;
}

Assistant:

SSD1306::OledPoint
SSD1306::drawString8x8(
    const OledPoint& p,
    const char* string,
    PixelStyle style,
    OledPixel& oled)
{
    OledPoint position{p};

    if (string != nullptr)
    {
        OledPoint start{p};

        while (*string != '\0')
        {
            if (*string == '\n')
            {
                position.set(
                    start.x(),
                    position.y() + sc_fontHeight8x8);
            }
            else
            {
                drawChar8x8(position, *string, style, oled);

                position.set(
                    position.x() + sc_fontWidth8x8,
                    position.y());
            }
            ++string;
        }
    }

    return position;
}